

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall model::undateIntercept(model *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = this->lambda1;
  fVar2 = this->z_intercept;
  fVar5 = 0.0;
  if (fVar1 < ABS(fVar2)) {
    fVar5 = *(float *)(&DAT_00104088 + (ulong)(fVar2 < 0.0) * 4);
    fVar3 = this->beta;
    fVar4 = this->n_intercept;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar5 = -(fVar1 * fVar5 + fVar2) / ((fVar3 + fVar4) / this->alpha + this->lambda2);
  }
  this->w_intercept = fVar5;
  return;
}

Assistant:

void model::undateIntercept() {
    if (abs(z_intercept) <= lambda1) {
        w_intercept = 0;
    } else {
        w_intercept = -(z_intercept - sign(z_intercept) * lambda1) / ((beta + sqrt(n_intercept)) / alpha + lambda2);
    }
}